

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureSummary.cpp
# Opt level: O2

uint64_t __thiscall
CaptureSummary::GetCountByNumber(CaptureSummary *this,char *table_name,uint32_t number)

{
  pointer pp_Var1;
  pointer pp_Var2;
  _capture_line *y;
  int iVar3;
  long lVar4;
  
  pp_Var1 = (this->summary).super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pp_Var2 = (this->summary).super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  lVar4 = 0;
  while( true ) {
    if ((long)pp_Var2 - (long)pp_Var1 >> 3 == lVar4) {
      return 0;
    }
    y = pp_Var1[lVar4];
    iVar3 = compare_string(table_name,y->registry_name);
    if (((iVar3 == 0) && (y->key_type == 0)) && ((y->field_2).key_number == number)) break;
    lVar4 = lVar4 + 1;
  }
  return y->count;
}

Assistant:

uint64_t CaptureSummary::GetCountByNumber(char const * table_name, uint32_t number)
{
    uint64_t count = 0;

    for (size_t i = 0; i < summary.size(); i++)
    {
        if (compare_string(table_name, summary[i]->registry_name) == 0 &&
            summary[i]->key_type == 0 &&
            summary[i]->key_number == (int)number)
        {
            count = summary[i]->count;
            break;
        }
    }

    return count;
}